

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CK_C_GetFunctionList p_Var8;
  CK_RV CVar9;
  undefined8 in_RSI;
  undefined4 in_EDI;
  CK_RV p11rv;
  CK_C_GetFunctionList pGetFunctionList;
  CK_SLOT_ID slotID;
  int rv;
  bool needP11;
  int action;
  int doDeleteToken;
  int doImport;
  int doShowSlots;
  int doInitToken;
  int importType;
  int noPublicKey;
  bool freeToken;
  undefined7 in_stack_00000070;
  int forceExec;
  char *errMsg;
  char *token;
  char *serial;
  char *slot;
  char *objectID;
  char *module;
  char *label;
  char *filePIN;
  char *userPIN;
  char *soPIN;
  char *inPath;
  int opt;
  int option_index;
  char *in_stack_00000420;
  char *in_stack_00000428;
  char *in_stack_00000430;
  CK_SLOT_ID in_stack_00000438;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  void **in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  uint local_9c;
  int local_94;
  uint local_80;
  char *local_48;
  undefined4 local_14;
  undefined8 local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_48 = (char *)0x0;
  local_80 = 0;
  bVar6 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  local_94 = 0;
  bVar1 = false;
  local_9c = 0;
  moduleHandle = (void *)0x0;
  p11 = (CK_FUNCTION_LIST_PTR)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (iVar7 = getopt_long(local_8,local_10,"hv",long_options,&local_14), iVar7 != -1) {
    switch(iVar7) {
    case 0x68:
    case 0x104:
    default:
      usage();
      exit(0);
    case 0x76:
    case 0x113:
      printf("%s\n","2.6.1");
      exit(0);
    case 0x100:
      bVar4 = true;
      local_94 = local_94 + 1;
      break;
    case 0x101:
      break;
    case 0x102:
      break;
    case 0x103:
      break;
    case 0x105:
      break;
    case 0x106:
      bVar3 = true;
      local_94 = local_94 + 1;
      bVar1 = true;
      break;
    case 0x107:
      iVar7 = strcmp(_optarg,"keypair");
      if (iVar7 == 0) {
        local_80 = 0;
      }
      else {
        iVar7 = strcmp(_optarg,"aes");
        if (iVar7 == 0) {
          local_80 = 1;
        }
        else {
          iVar7 = strcmp(_optarg,"cert");
          if (iVar7 == 0) {
            local_80 = 2;
          }
          else {
            fprintf(_stderr,"ERROR: Invalid import type \'%s\'\n",_optarg);
          }
        }
      }
      break;
    case 0x108:
      bVar6 = true;
      local_94 = local_94 + 1;
      bVar1 = true;
      break;
    case 0x109:
      break;
    case 0x10a:
      local_48 = _optarg;
      break;
    case 0x10b:
      break;
    case 0x10c:
      break;
    case 0x10d:
      break;
    case 0x10e:
      bVar2 = true;
      local_94 = local_94 + 1;
      bVar1 = true;
      break;
    case 0x10f:
      iVar7 = strcmp(_optarg,"default-pkcs11-lib");
      if (iVar7 == 0) {
        printf("%s\n","/usr/local/lib/softhsm/libsofthsm2.so");
        exit(0);
      }
      fprintf(_stderr,"ERROR: Invalid configuration key \'%s\'\n",_optarg);
      exit(1);
    case 0x110:
      break;
    case 0x111:
      break;
    case 0x112:
      break;
    case 0x114:
      local_80 = 1;
    }
  }
  if (local_94 != 1) {
    usage();
    exit(1);
  }
  if (bVar1) {
    bVar5 = checkSetup();
    if (!bVar5) {
      fprintf(_stderr,"ERROR: Please verify that the SoftHSM configuration is correct.\n");
      exit(1);
    }
    p_Var8 = loadLibrary(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         (char **)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (p_Var8 == (CK_C_GetFunctionList)0x0) {
      fprintf(_stderr,"ERROR: Could not load the PKCS#11 library/module: %s\n",0);
      fprintf(_stderr,"ERROR: Please check log files for additional information.\n");
      exit(1);
    }
    (*p_Var8)(&p11);
    CVar9 = (*p11->C_Initialize)((void *)0x0);
    if (CVar9 != 0) {
      if (local_48 == (char *)0x0) {
        local_48 = "/usr/local/lib/softhsm/libsofthsm2.so";
      }
      fprintf(_stderr,"ERROR: Could not initialize the PKCS#11 library/module: %s\n",local_48);
      fprintf(_stderr,"ERROR: Please check log files for additional information.\n");
      exit(1);
    }
  }
  if ((bVar6) &&
     (local_9c = findSlot(serial,token,errMsg,forceExec._3_1_,_importType), local_9c == 0)) {
    local_9c = initToken(in_stack_00000438,in_stack_00000430,in_stack_00000428,in_stack_00000420);
  }
  if ((local_9c == 0) && (bVar2)) {
    local_9c = showSlots();
  }
  if (((local_9c == 0) && (bVar3)) &&
     (local_9c = findSlot(serial,token,errMsg,
                          (CK_SLOT_ID *)CONCAT17(forceExec._3_1_,in_stack_00000070)), local_9c == 0)
     ) {
    if (local_80 == 0) {
      local_9c = importKeyPair(objectID,slot,(CK_SLOT_ID)serial,token,errMsg,
                               (char *)CONCAT17(forceExec._3_1_,in_stack_00000070),(int)filePIN,
                               (int)userPIN);
    }
    else if (local_80 == 1) {
      local_9c = importSecretKey(serial,(CK_SLOT_ID)token,errMsg,
                                 (char *)CONCAT17(forceExec._3_1_,in_stack_00000070),
                                 (char *)_importType);
    }
    else if (local_80 == 2) {
      local_9c = importCertificate(serial,(CK_SLOT_ID)token,errMsg,
                                   (char *)CONCAT17(forceExec._3_1_,in_stack_00000070),
                                   (char *)_importType,doInitToken);
    }
    else {
      fprintf(_stderr,"Invalid importType %d.\n",(ulong)local_80);
      local_9c = 1;
    }
  }
  if ((local_9c == 0) && (bVar4)) {
    bVar6 = deleteToken((char *)CONCAT44(userPIN._4_4_,(int)userPIN),
                        (char *)CONCAT44(filePIN._4_4_,(int)filePIN));
    local_9c = (uint)!bVar6;
  }
  if (bVar1) {
    (*p11->C_Finalize)((void *)0x0);
    unloadLibrary((void *)0x112883);
  }
  return local_9c;
}

Assistant:

int main(int argc, char* argv[])
{
	int option_index = 0;
	int opt;

	char* inPath = NULL;
	char* soPIN = NULL;
	char* userPIN = NULL;
	char* filePIN = NULL;
	char* label = NULL;
	char* module = NULL;
	char* objectID = NULL;
	char* slot = NULL;
	char* serial = NULL;
	char* token = NULL;
	char* errMsg = NULL;
	int forceExec = 0;
	bool freeToken = false;
	int noPublicKey = 0;
	int importType = IMPORT_TYPE_KEYPAIR;

	int doInitToken = 0;
	int doShowSlots = 0;
	int doImport = 0;
	int doDeleteToken = 0;
	int action = 0;
	bool needP11 = false;
	int rv = 0;
	CK_SLOT_ID slotID = 0;

	moduleHandle = NULL;
	p11 = NULL;

	while ((opt = getopt_long(argc, argv, "hv", long_options, &option_index)) != -1)
	{
		switch (opt)
		{
			case OPT_SHOW_SLOTS:
				doShowSlots = 1;
				action++;
				needP11 = true;
				break;
			case OPT_SHOW_CONFIG:
				if (!strcmp(optarg, "default-pkcs11-lib"))
				{
					printf("%s\n", DEFAULT_PKCS11_LIB);
					exit(0);
				}
				else
				{
					fprintf(stderr, "ERROR: Invalid configuration key '%s'\n", optarg);
					exit(1);
				}
				break;
			case OPT_INIT_TOKEN:
				doInitToken = 1;
				action++;
				needP11 = true;
				break;
			case OPT_IMPORT:
				doImport = 1;
				action++;
				inPath = optarg;
				needP11 = true;
				break;
			case OPT_IMPORT_TYPE:
				if (!strcmp(optarg, "keypair"))
					importType = IMPORT_TYPE_KEYPAIR;
				else if (!strcmp(optarg, "aes"))
					importType = IMPORT_TYPE_AES;
				else if (!strcmp(optarg, "cert"))
					importType = IMPORT_TYPE_CERT;
				else
				{
					fprintf(stderr, "ERROR: Invalid import type '%s'\n", optarg);
				}
				break;
			case OPT_AES:
				importType = IMPORT_TYPE_AES;
				break;
			case OPT_DELETE_TOKEN:
				doDeleteToken = 1;
				action++;
				break;
			case OPT_SLOT:
				slot = optarg;
				break;
			case OPT_LABEL:
				label = optarg;
				break;
			case OPT_SERIAL:
				serial = optarg;
				break;
			case OPT_TOKEN:
				token = optarg;
				break;
			case OPT_MODULE:
				module = optarg;
				break;
			case OPT_NO_PUBLIC_KEY:
				noPublicKey = 1;
				break;
			case OPT_ID:
				objectID = optarg;
				break;
			case OPT_SO_PIN:
				soPIN = optarg;
				break;
			case OPT_PIN:
				userPIN = optarg;
				break;
			case OPT_FILE_PIN:
				filePIN = optarg;
				break;
			case OPT_FORCE:
				forceExec = 1;
				break;
			case OPT_FREE:
				freeToken = true;
				break;
			case OPT_VERSION:
			case 'v':
				printf("%s\n", PACKAGE_VERSION);
				exit(0);
				break;
			case OPT_HELP:
			case 'h':
			default:
				usage();
				exit(0);
				break;
		}
	}

	// No action given, display the usage.
	if (action != 1)
	{
		usage();
		exit(1);
	}

	if (needP11)
	{
		// Check the basic setup of SoftHSM
		if (!checkSetup())
		{
			fprintf(stderr, "ERROR: Please verify that the SoftHSM configuration is correct.\n");
			exit(1);
		}

		// Get a pointer to the function list for PKCS#11 library
		CK_C_GetFunctionList pGetFunctionList = loadLibrary(module, &moduleHandle, &errMsg);
		if (!pGetFunctionList)
		{
			fprintf(stderr, "ERROR: Could not load the PKCS#11 library/module: %s\n", errMsg);
			fprintf(stderr, "ERROR: Please check log files for additional information.\n");
			exit(1);
		}

		// Load the function list
		(*pGetFunctionList)(&p11);

		// Initialize the library
		CK_RV p11rv = p11->C_Initialize(NULL_PTR);
		if (p11rv != CKR_OK)
		{
			fprintf(stderr, "ERROR: Could not initialize the PKCS#11 library/module: %s\n", module ? module : DEFAULT_PKCS11_LIB);
			fprintf(stderr, "ERROR: Please check log files for additional information.\n");
			exit(1);
		}
	}

	// We should create the token.
	if (doInitToken)
	{
		// Get the slotID
		rv = findSlot(slot, serial, token, freeToken, slotID);
		if (!rv)
		{
			rv = initToken(slotID, label, soPIN, userPIN);
		}
	}

	// Show all available slots
	if (!rv && doShowSlots)
	{
		rv = showSlots();
	}

	// Import a key pair from the given path
	if (!rv && doImport)
	{
		// Get the slotID
		rv = findSlot(slot, serial, token, slotID);
		if (!rv)
		{
			switch(importType)
			{
				case IMPORT_TYPE_KEYPAIR:
					rv = importKeyPair(inPath, filePIN, slotID, userPIN, label, objectID, forceExec, noPublicKey);
					break;
				case IMPORT_TYPE_AES:
					rv = importSecretKey(inPath, slotID, userPIN, label, objectID);
					break;
				case IMPORT_TYPE_CERT:
					rv = importCertificate(inPath, slotID, userPIN, label, objectID, forceExec);
					break;
				default:
					fprintf(stderr, "Invalid importType %d.\n", importType);
					rv = 1;
					break;
			}
		}
	}

	// We should delete the token.
	if (!rv && doDeleteToken)
	{
		if (deleteToken(serial, token))
		{
			rv = 0;
		}
		else
		{
			rv = 1;
		}
	}

	// Finalize the library
	if (needP11)
	{
		p11->C_Finalize(NULL_PTR);
		unloadLibrary(moduleHandle);
	}

	return rv;
}